

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O1

void __thiscall NaControlLaw::Reset(NaControlLaw *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  NaDataFile *pNVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  
  NaPrintLog("Control law (set point) init\n");
  switch(this->source) {
  case clsDescription:
    uVar1 = (this->items).nItems;
    if ((int)uVar1 < 1) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = 0.0;
      uVar5 = 0;
      do {
        iVar2 = (*(this->items)._vptr_NaDynAr[0xf])(&this->items,uVar5);
        dVar6 = dVar6 + *(double *)(CONCAT44(extraout_var,iVar2) + 0x30);
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while ((int)uVar4 < (this->items).nItems);
    }
    NaPrintLog("..description (%d items) with total duration %g s\n",dVar6,(ulong)uVar1);
    return;
  case clsFromFile:
    NaPrintLog("..from file \"%s\"\n",this->filepath);
    pNVar3 = OpenInputDataFile(this->filepath);
    this->dataio = pNVar3;
    (*pNVar3->_vptr_NaDataFile[5])(pNVar3);
    this->prev_index = 0;
    break;
  case clsManual:
    NaPrintLog("..manual from value %g\n",this->start_value);
    this->current_value = this->start_value;
    break;
  case clsRandom:
    NaLinearNoiseGen::Reset(&this->lin_rand);
    return;
  }
  return;
}

Assistant:

void    NaControlLaw::Reset ()
{
    NaPrintLog("Control law (set point) init\n");

    switch(source){

    case clsRandom:
        lin_rand.Reset();
        break;

    case clsDescription:
        NaPrintLog("..description (%d items) with total duration %g s\n",
                   items.count(), TotalTimeLength());
        break;

    case clsManual:
        NaPrintLog("..manual from value %g\n", start_value);
        current_value = start_value;
        break;

    case clsFromFile:
        NaPrintLog("..from file \"%s\"\n", filepath);
        try{
            // Open the file
            dataio = OpenInputDataFile(filepath);
            dataio->GoStartRecord();
            prev_index = 0;
        }
        catch(NaException exCode){
            // Handle file exceptions
            dataio = NULL;
            NaPrintLog("..can't open file \"%s\": exception code %d\n",
                       filepath, -1);
        }
        break;
    }
}